

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O3

PmError Pm_SetChannelMask(PortMidiStream *stream,int mask)

{
  if (stream != (PortMidiStream *)0x0) {
    *(int *)((long)stream + 0x3c) = mask;
    return pmNoData;
  }
  return pmBadPtr;
}

Assistant:

PMEXPORT PmError Pm_SetChannelMask(PortMidiStream *stream, int mask)
{
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;

    if (midi == NULL)
        err = pmBadPtr;
    else
        midi->channel_mask = mask;

    return pm_errmsg(err);
}